

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseAllResolveElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAllResolveElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements)

{
  ScriptContext *scriptContext;
  DynamicObject *prototype;
  JavascriptMethod entryPoint_00;
  ScriptContext **ppSVar1;
  DynamicObject **ppDVar2;
  DynamicTypeHandler *typeHandler;
  Recycler *pRVar3;
  JavascriptPromiseAllResolveElementFunction *this_00;
  Var pvVar4;
  FunctionInfo *pFVar5;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_79;
  TrackAllocData local_78;
  JavascriptPromiseAllResolveElementFunction *local_50;
  JavascriptPromiseAllResolveElementFunction *function;
  DynamicType *type;
  FunctionInfo *functionInfo;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements_local;
  JavascriptPromiseCapability *capabilities_local;
  JavascriptArray *values_local;
  JavascriptMethod p_Stack_18;
  uint32 index_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  undefined4 uVar6;
  
  type = (DynamicType *)JavascriptPromise::EntryInfo::AllResolveElementFunction;
  functionInfo = (FunctionInfo *)remainingElements;
  remainingElements_local =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)capabilities;
  capabilities_local = (JavascriptPromiseCapability *)values;
  values_local._4_4_ = index;
  p_Stack_18 = entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = p_Stack_18;
  prototype = *ppDVar2;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  function = (JavascriptPromiseAllResolveElementFunction *)
             DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                              entryPoint_00,typeHandler,false,false);
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&JavascriptPromiseAllResolveElementFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19fd);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_78);
  this_00 = (JavascriptPromiseAllResolveElementFunction *)
            new<(Memory::ObjectInfoBits)1>(0x68,pRVar3,&local_79);
  pFVar5 = functionInfo;
  JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
            (this_00,(DynamicType *)function,(FunctionInfo *)type,values_local._4_4_,
             (JavascriptArray *)capabilities_local,
             (JavascriptPromiseCapability *)remainingElements_local,
             (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)functionInfo);
  uVar6 = (undefined4)((ulong)pFVar5 >> 0x20);
  local_50 = this_00;
  pvVar4 = TaggedInt::ToVarUnchecked(1);
  (*(this_00->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(this_00,0xd1,pvVar4,2,0,0,CONCAT44(uVar6,0xf));
  return local_50;
}

Assistant:

JavascriptPromiseAllResolveElementFunction* JavascriptLibrary::CreatePromiseAllResolveElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AllResolveElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAllResolveElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAllResolveElementFunction, type, functionInfo, index, values, capabilities, remainingElements);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }